

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_address.cpp
# Opt level: O0

int CfdGetDescriptorMultisigKey
              (void *handle,void *descriptor_handle,uint32_t key_index,int *key_type,char **pubkey,
              char **ext_pubkey,char **ext_privkey)

{
  bool bVar1;
  size_type sVar2;
  undefined8 uVar3;
  ulong uVar4;
  int *in_RCX;
  uint in_EDX;
  long in_RSI;
  undefined8 *in_R8;
  undefined8 *in_R9;
  undefined8 *in_stack_00000008;
  CfdException *except;
  exception *std_except;
  ExtPrivkey ext_privkey_obj;
  ExtPubkey ext_pubkey_obj;
  Pubkey pubkey_obj;
  DescriptorKeyData key_data;
  CfdCapiOutputDescriptor *buffer;
  char *work_ext_privkey;
  char *work_ext_pubkey;
  char *work_pubkey;
  DescriptorKeyData *in_stack_fffffffffffffb58;
  ExtPrivkey *in_stack_fffffffffffffb60;
  undefined7 in_stack_fffffffffffffb70;
  undefined1 in_stack_fffffffffffffb77;
  undefined8 in_stack_fffffffffffffb78;
  CfdError error_code;
  undefined7 in_stack_fffffffffffffb80;
  undefined1 in_stack_fffffffffffffb87;
  ExtPrivkey *in_stack_fffffffffffffbc0;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  string *in_stack_fffffffffffffc68;
  pointer in_stack_fffffffffffffc70;
  Pubkey local_380;
  ExtPubkey local_368;
  Pubkey local_2f8;
  ExtPubkey local_2e0;
  ExtPrivkey local_270;
  ExtPrivkey local_1f8;
  ExtPubkey local_180;
  Pubkey local_110;
  int local_f8;
  string local_f0;
  undefined1 local_ca;
  allocator local_c9;
  string local_c8 [32];
  CfdSourceLocation local_a8;
  long local_90;
  allocator local_81;
  string local_80 [48];
  char *local_50;
  char *local_48;
  char *local_40;
  undefined8 *local_38;
  undefined8 *local_30;
  int *local_28;
  uint local_1c;
  long local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffb78 >> 0x20);
  local_40 = (char *)0x0;
  local_48 = (char *)0x0;
  local_50 = (char *)0x0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"Descriptor",&local_81);
  cfd::capi::CheckBuffer(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  local_90 = local_18;
  if ((*(long *)(local_18 + 0x20) == 0) ||
     (uVar4 = (ulong)local_1c,
     sVar2 = std::vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>::size
                       (*(vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> **
                         )(local_18 + 0x20)), sVar2 <= uVar4)) {
    local_a8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_address.cpp"
                 ,0x2f);
    local_a8.filename = local_a8.filename + 1;
    local_a8.line = 0x2f4;
    local_a8.funcname = "CfdGetDescriptorMultisigKey";
    cfd::core::logger::warn<>(&local_a8,"key index is maximum over.");
    local_ca = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_c8,"Failed to parameter. key index is maximum over.",&local_c9);
    cfd::core::CfdException::CfdException
              ((CfdException *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
               error_code,(string *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70));
    local_ca = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>::operator[]
            (*(vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> **)
              (local_90 + 0x20),(ulong)local_1c);
  cfd::DescriptorKeyData::DescriptorKeyData
            ((DescriptorKeyData *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  if (local_28 != (int *)0x0) {
    *local_28 = local_f8;
  }
  cfd::core::Pubkey::Pubkey(&local_110);
  cfd::core::ExtPubkey::ExtPubkey(&local_180);
  cfd::core::ExtPrivkey::ExtPrivkey(&local_1f8);
  if (local_f8 != 1) {
    if (local_f8 == 2) {
      cfd::core::ExtPubkey::ExtPubkey(&local_368,&local_f0);
      cfd::core::ExtPubkey::operator=(&local_180,&local_368);
      cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_fffffffffffffb60);
      cfd::core::ExtPubkey::GetPubkey(&local_380,&local_180);
      cfd::core::Pubkey::operator=(&local_110,&local_380);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x583def);
      goto LAB_00583e43;
    }
    if (local_f8 == 3) {
      cfd::core::ExtPrivkey::ExtPrivkey(&local_270,&local_f0);
      in_stack_fffffffffffffbc0 = &local_1f8;
      cfd::core::ExtPrivkey::operator=(in_stack_fffffffffffffbc0,&local_270);
      cfd::core::ExtPrivkey::~ExtPrivkey(in_stack_fffffffffffffb60);
      cfd::core::ExtPrivkey::GetExtPubkey(&local_2e0,in_stack_fffffffffffffbc0);
      cfd::core::ExtPubkey::operator=(&local_180,&local_2e0);
      cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_fffffffffffffb60);
      cfd::core::ExtPubkey::GetPubkey(&local_2f8,&local_180);
      cfd::core::Pubkey::operator=(&local_110,&local_2f8);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x583d5b);
      goto LAB_00583e43;
    }
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    cfd::core::Pubkey::Pubkey((Pubkey *)&stack0xfffffffffffffc68,&local_f0);
    cfd::core::Pubkey::operator=(&local_110,(Pubkey *)&stack0xfffffffffffffc68);
    cfd::core::Pubkey::~Pubkey((Pubkey *)0x583e41);
  }
LAB_00583e43:
  if ((local_30 != (undefined8 *)0x0) && (bVar1 = cfd::core::Pubkey::IsValid(&local_110), bVar1)) {
    cfd::core::Pubkey::GetHex_abi_cxx11_(&local_3b8,&local_110);
    local_40 = cfd::capi::CreateString((string *)in_stack_fffffffffffffbc0);
    std::__cxx11::string::~string((string *)&local_3b8);
  }
  if ((local_38 != (undefined8 *)0x0) && (bVar1 = cfd::core::ExtPubkey::IsValid(&local_180), bVar1))
  {
    cfd::core::ExtPubkey::ToString_abi_cxx11_(&local_3d8,&local_180);
    local_48 = cfd::capi::CreateString((string *)in_stack_fffffffffffffbc0);
    std::__cxx11::string::~string((string *)&local_3d8);
  }
  if ((in_stack_00000008 != (undefined8 *)0x0) &&
     (bVar1 = cfd::core::ExtPrivkey::IsValid(&local_1f8), bVar1)) {
    cfd::core::ExtPrivkey::ToString_abi_cxx11_(&local_3f8,&local_1f8);
    local_50 = cfd::capi::CreateString((string *)in_stack_fffffffffffffbc0);
    std::__cxx11::string::~string((string *)&local_3f8);
  }
  if (local_40 != (char *)0x0) {
    *local_30 = local_40;
  }
  if (local_48 != (char *)0x0) {
    *local_38 = local_48;
  }
  if (local_50 != (char *)0x0) {
    *in_stack_00000008 = local_50;
  }
  local_4 = 0;
  cfd::core::ExtPrivkey::~ExtPrivkey(in_stack_fffffffffffffb60);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_fffffffffffffb60);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x58409a);
  cfd::DescriptorKeyData::~DescriptorKeyData((DescriptorKeyData *)0x5840a7);
  return local_4;
}

Assistant:

int CfdGetDescriptorMultisigKey(
    void* handle, void* descriptor_handle, uint32_t key_index, int* key_type,
    char** pubkey, char** ext_pubkey, char** ext_privkey) {
  char* work_pubkey = nullptr;
  char* work_ext_pubkey = nullptr;
  char* work_ext_privkey = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(descriptor_handle, kPrefixOutputDescriptor);

    CfdCapiOutputDescriptor* buffer =
        static_cast<CfdCapiOutputDescriptor*>(descriptor_handle);
    if ((buffer->multisig_key_list == nullptr) ||
        (key_index >= buffer->multisig_key_list->size())) {
      warn(CFD_LOG_SOURCE, "key index is maximum over.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. key index is maximum over.");
    }

    DescriptorKeyData key_data = (*buffer->multisig_key_list)[key_index];
    if (key_type != nullptr) {
      *key_type = key_data.type;
    }

    Pubkey pubkey_obj;
    ExtPubkey ext_pubkey_obj;
    ExtPrivkey ext_privkey_obj;
    switch (key_data.type) {
      case DescriptorKeyType::kDescriptorKeyBip32Priv:
        ext_privkey_obj = ExtPrivkey(key_data.key);
        ext_pubkey_obj = ext_privkey_obj.GetExtPubkey();
        pubkey_obj = ext_pubkey_obj.GetPubkey();
        break;
      case DescriptorKeyType::kDescriptorKeyBip32:
        ext_pubkey_obj = ExtPubkey(key_data.key);
        pubkey_obj = ext_pubkey_obj.GetPubkey();
        break;
      case DescriptorKeyType::kDescriptorKeyPublic:
      default:
        if (!key_data.key.empty()) pubkey_obj = Pubkey(key_data.key);
        break;
    }
    if ((pubkey != nullptr) && (pubkey_obj.IsValid())) {
      work_pubkey = CreateString(pubkey_obj.GetHex());
    }
    if ((ext_pubkey != nullptr) && (ext_pubkey_obj.IsValid())) {
      work_ext_pubkey = CreateString(ext_pubkey_obj.ToString());
    }
    if ((ext_privkey != nullptr) && (ext_privkey_obj.IsValid())) {
      work_ext_privkey = CreateString(ext_privkey_obj.ToString());
    }

    if (work_pubkey != nullptr) *pubkey = work_pubkey;
    if (work_ext_pubkey != nullptr) *ext_pubkey = work_ext_pubkey;
    if (work_ext_privkey != nullptr) *ext_privkey = work_ext_privkey;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    FreeBufferOnError(&work_pubkey, &work_ext_pubkey, &work_ext_privkey);
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    FreeBufferOnError(&work_pubkey, &work_ext_pubkey, &work_ext_privkey);
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    FreeBufferOnError(&work_pubkey, &work_ext_pubkey, &work_ext_privkey);
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}